

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp:246:56)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_function_object_cpp:246:56)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap_ptr_untyped local_38;
  gc_heap_ptr_untyped local_28;
  
  anon_unknown_65::get_function_object_ptr((anon_unknown_65 *)&local_28,this_);
  function_object::bind((int)&local_38,(sockaddr *)&local_28,(socklen_t)args);
  __return_storage_ptr__->type_ = object;
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = local_38.heap_;
  *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_38.pos_;
  if (local_38.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_38.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_28);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }